

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall wallet::CWallet::transactionAddedToMempool(CWallet *this,CTransactionRef *tx)

{
  element_type *peVar1;
  pointer pCVar2;
  bool bVar3;
  iterator iVar4;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var5;
  _Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> __tmp;
  pointer __k;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  pVar8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock26;
  unique_lock<std::recursive_mutex> local_78;
  undefined1 local_68 [24];
  code *local_50;
  __index_type local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_78._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_78);
  local_40 = '\x01';
  bVar3 = AddToWalletIfInvolvingMe(this,tx,(SyncTxState *)local_68,true,false);
  if (bVar3) {
    MarkInputsDirty(this,tx);
  }
  iVar4 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->mapWallet)._M_h,
                 &(((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->hash).m_wrapped);
  if (iVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur !=
      (__node_type *)0x0) {
    if (this->m_chain == (Chain *)0x0) {
      __assert_fail("m_chain",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                    ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
    }
    RefreshMempoolStatus
              ((CWalletTx *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                      _M_cur + 0x28),this->m_chain);
  }
  peVar1 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __k = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start;
  pCVar2 = (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__k != pCVar2) {
    do {
      pVar8 = std::
              _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
              ::equal_range(&(this->mapTxSpends)._M_h,&__k->prevout);
      for (_Var5._M_cur = (__node_type *)
                          pVar8.first.
                          super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                          _M_cur;
          (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var5._M_cur !=
          pVar8.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur.
          super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>;
          _Var5._M_cur = (__node_type *)((_Var5._M_cur)->super__Hash_node_base)._M_nxt) {
        auVar7[0] = -((peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x24]);
        auVar7[1] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 1) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x25]);
        auVar7[2] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 2) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x26]);
        auVar7[3] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 3) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x27]);
        auVar7[4] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 4) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x28]);
        auVar7[5] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 5) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x29]);
        auVar7[6] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 6) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x2a]);
        auVar7[7] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 7) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x2b]);
        auVar7[8] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 8) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x2c]);
        auVar7[9] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 9) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x2d]);
        auVar7[10] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 10) ==
                      ((_Var5._M_cur)->
                      super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                      super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                      _M_storage.__data[0x2e]);
        auVar7[0xb] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                         _M_elems + 0xb) ==
                       ((_Var5._M_cur)->
                       super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                       super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                       _M_storage.__data[0x2f]);
        auVar7[0xc] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                         _M_elems + 0xc) ==
                       ((_Var5._M_cur)->
                       super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                       super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                       _M_storage.__data[0x30]);
        auVar7[0xd] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                         _M_elems + 0xd) ==
                       ((_Var5._M_cur)->
                       super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                       super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                       _M_storage.__data[0x31]);
        auVar7[0xe] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                         _M_elems + 0xe) ==
                       ((_Var5._M_cur)->
                       super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                       super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                       _M_storage.__data[0x32]);
        auVar7[0xf] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                         _M_elems + 0xf) ==
                       ((_Var5._M_cur)->
                       super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                       super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                       _M_storage.__data[0x33]);
        auVar6[0] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0x10) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x34]);
        auVar6[1] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0x11) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x35]);
        auVar6[2] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0x12) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x36]);
        auVar6[3] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0x13) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x37]);
        auVar6[4] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0x14) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x38]);
        auVar6[5] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0x15) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x39]);
        auVar6[6] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0x16) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x3a]);
        auVar6[7] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0x17) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x3b]);
        auVar6[8] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0x18) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x3c]);
        auVar6[9] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0x19) ==
                     ((_Var5._M_cur)->
                     super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                     super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                     _M_storage.__data[0x3d]);
        auVar6[10] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                        _M_elems + 0x1a) ==
                      ((_Var5._M_cur)->
                      super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                      super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                      _M_storage.__data[0x3e]);
        auVar6[0xb] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                         _M_elems + 0x1b) ==
                       ((_Var5._M_cur)->
                       super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                       super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                       _M_storage.__data[0x3f]);
        auVar6[0xc] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                         _M_elems + 0x1c) ==
                       ((_Var5._M_cur)->
                       super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                       super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                       _M_storage.__data[0x40]);
        auVar6[0xd] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                         _M_elems + 0x1d) ==
                       ((_Var5._M_cur)->
                       super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                       super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                       _M_storage.__data[0x41]);
        auVar6[0xe] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                         _M_elems + 0x1e) ==
                       ((_Var5._M_cur)->
                       super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                       super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                       _M_storage.__data[0x42]);
        auVar6[0xf] = -(*(uchar *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data.
                                         _M_elems + 0x1f) ==
                       ((_Var5._M_cur)->
                       super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                       super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>._M_storage.
                       _M_storage.__data[0x43]);
        auVar6 = auVar6 & auVar7;
        if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) != 0xffff) {
          local_68._8_8_ = 0;
          local_50 = std::
                     _Function_handler<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:1447:65)>
                     ::_M_invoke;
          local_68._16_8_ =
               std::
               _Function_handler<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:1447:65)>
               ::_M_manager;
          local_68._0_8_ = &peVar1->hash;
          RecursiveUpdateTxState
                    (this,(WalletBatch *)0x0,
                     (uint256 *)
                     ((long)&((_Var5._M_cur)->
                             super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>).
                             super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>.
                             _M_storage._M_storage + 0x24),(TryUpdatingStateFn *)local_68);
          if ((code *)local_68._16_8_ != (code *)0x0) {
            (*(code *)local_68._16_8_)
                      ((TryUpdatingStateFn *)local_68,(TryUpdatingStateFn *)local_68,3);
          }
        }
      }
      __k = __k + 1;
    } while (__k != pCVar2);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::transactionAddedToMempool(const CTransactionRef& tx) {
    LOCK(cs_wallet);
    SyncTransaction(tx, TxStateInMempool{});

    auto it = mapWallet.find(tx->GetHash());
    if (it != mapWallet.end()) {
        RefreshMempoolStatus(it->second, chain());
    }

    const Txid& txid = tx->GetHash();

    for (const CTxIn& tx_in : tx->vin) {
        // For each wallet transaction spending this prevout..
        for (auto range = mapTxSpends.equal_range(tx_in.prevout); range.first != range.second; range.first++) {
            const uint256& spent_id = range.first->second;
            // Skip the recently added tx
            if (spent_id == txid) continue;
            RecursiveUpdateTxState(/*batch=*/nullptr, spent_id, [&txid](CWalletTx& wtx) EXCLUSIVE_LOCKS_REQUIRED(cs_wallet) {
                return wtx.mempool_conflicts.insert(txid).second ? TxUpdate::CHANGED : TxUpdate::UNCHANGED;
            });
        }
    }
}